

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O1

_Bool art_internal_validate_at(art_node_t *node,art_internal_validate_t validator)

{
  long lVar1;
  long lVar2;
  art_node_t aVar3;
  bool bVar4;
  art_internal_validate_t validator_00;
  art_internal_validate_t validator_01;
  art_internal_validate_t validator_02;
  art_internal_validate_t validator_03;
  art_validate_cb_t p_Var5;
  _Bool _Var6;
  int iVar7;
  char **ppcVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  art_node_t *paVar17;
  long lVar18;
  bool bVar19;
  undefined8 local_58;
  art_key_chunk_t aStack_50;
  art_key_chunk_t aStack_4f;
  undefined6 uStack_4e;
  long local_40;
  long local_38;
  
  iVar7 = validator.depth;
  ppcVar8 = validator.reason;
  if (node == (art_node_t *)0x0) {
    pcVar10 = "node is null";
  }
  else if (((ulong)node & 1) == 0) {
    aVar3 = node[1];
    if ((int)(validator.depth + (uint)(byte)aVar3) < 6) {
      memcpy(validator.current_key + validator.depth,node + 2,(ulong)(byte)aVar3);
      p_Var5 = validator.validate_cb;
      ppcVar8 = validator.reason;
      validator.depth = validator.depth + (uint)(byte)aVar3;
      switch(*node) {
      case (art_node_t)0x0:
        aStack_50 = validator.current_key[4];
        aStack_4f = validator.current_key[5];
        uStack_4e = validator._26_6_;
        aVar3 = node[7];
        if (aVar3 == (art_node_t)0x0) {
          pcVar10 = "Node4 has no children";
        }
        else if ((byte)aVar3 < 5) {
          if (aVar3 != (art_node_t)0x1) {
            local_58 = CONCAT44(validator.current_key._0_4_,validator.depth + 1);
            paVar17 = node + 0x20;
            lVar16 = 1;
            lVar15 = -1;
            lVar18 = -2;
            uVar14 = 0;
            do {
              uVar9 = uVar14;
              uVar11 = (ulong)(byte)node[7];
              if (uVar11 <= uVar9) {
                return true;
              }
              if ((uVar9 != 0) && ((byte)node[uVar9 + 8] <= (byte)node[uVar9 + 7])) {
                pcVar10 = "Node4 keys are not strictly increasing";
LAB_0010760a:
                *ppcVar8 = pcVar10;
                break;
              }
              bVar19 = uVar9 + 1 < uVar11;
              if (bVar19) {
                if (*(long *)(node + uVar9 * 8 + 0x10) != *(long *)(node + lVar16 * 8 + 0x10)) {
                  lVar12 = 0;
                  do {
                    if (lVar18 + uVar11 == lVar12) goto LAB_0010758a;
                    lVar1 = lVar12 + 1;
                    lVar2 = lVar12 * 8;
                    lVar12 = lVar1;
                  } while (*(long *)(node + uVar9 * 8 + 0x10) != *(long *)(paVar17 + lVar2));
                  bVar19 = (ulong)(lVar1 - lVar15) < uVar11;
                }
                *ppcVar8 = "Node4 has duplicate children";
                if (bVar19) break;
              }
LAB_0010758a:
              *(art_node_t *)((long)&local_58 + (long)(int)local_58 + 3) = node[uVar9 + 8];
              validator_03.validate_cb = p_Var5;
              validator_03.reason = ppcVar8;
              validator_03.depth = (int)local_58;
              validator_03.current_key[0] = local_58._4_1_;
              validator_03.current_key[1] = local_58._5_1_;
              validator_03.current_key[2] = local_58._6_1_;
              validator_03.current_key[3] = local_58._7_1_;
              validator_03.current_key[4] = aStack_50;
              validator_03.current_key[5] = aStack_4f;
              validator_03._26_6_ = uStack_4e;
              local_40 = lVar16;
              local_38 = lVar15;
              _Var6 = art_internal_validate_at
                                (*(art_node_t **)(node + uVar9 * 8 + 0x10),validator_03);
              lVar16 = local_40 + 1;
              lVar15 = local_38 + -1;
              paVar17 = paVar17 + 8;
              lVar18 = lVar18 + -1;
              uVar14 = uVar9 + 1;
            } while (_Var6);
            goto LAB_0010760d;
          }
          pcVar10 = "Node4 and child node should have been combined";
        }
        else {
          pcVar10 = "Node4 has too many children";
        }
        break;
      case (art_node_t)0x1:
        aStack_50 = validator.current_key[4];
        aStack_4f = validator.current_key[5];
        uStack_4e = validator._26_6_;
        if ((byte)node[7] < 5) {
          pcVar10 = "Node16 has too few children";
        }
        else {
          if ((byte)node[7] < 0x11) {
            local_58 = CONCAT44(validator.current_key._0_4_,validator.depth + 1);
            paVar17 = node + 0x28;
            lVar16 = 1;
            lVar15 = -1;
            lVar18 = -2;
            uVar14 = 0;
            do {
              uVar9 = uVar14;
              uVar11 = (ulong)(byte)node[7];
              if (uVar11 <= uVar9) {
                return true;
              }
              if ((uVar9 != 0) && ((byte)node[uVar9 + 8] <= (byte)node[uVar9 + 7])) {
                pcVar10 = "Node16 keys are not strictly increasing";
                goto LAB_0010760a;
              }
              bVar19 = uVar9 + 1 < uVar11;
              if (bVar19) {
                if (*(long *)(node + uVar9 * 8 + 0x18) != *(long *)(node + lVar16 * 8 + 0x18)) {
                  lVar12 = 0;
                  do {
                    if (lVar18 + uVar11 == lVar12) goto LAB_00107469;
                    lVar1 = lVar12 + 1;
                    lVar2 = lVar12 * 8;
                    lVar12 = lVar1;
                  } while (*(long *)(node + uVar9 * 8 + 0x18) != *(long *)(paVar17 + lVar2));
                  bVar19 = (ulong)(lVar1 - lVar15) < uVar11;
                }
                *ppcVar8 = "Node16 has duplicate children";
                if (bVar19) break;
              }
LAB_00107469:
              *(art_node_t *)((long)&local_58 + (long)(int)local_58 + 3) = node[uVar9 + 8];
              validator_02.validate_cb = p_Var5;
              validator_02.reason = ppcVar8;
              validator_02.depth = (int)local_58;
              validator_02.current_key[0] = local_58._4_1_;
              validator_02.current_key[1] = local_58._5_1_;
              validator_02.current_key[2] = local_58._6_1_;
              validator_02.current_key[3] = local_58._7_1_;
              validator_02.current_key[4] = aStack_50;
              validator_02.current_key[5] = aStack_4f;
              validator_02._26_6_ = uStack_4e;
              local_40 = lVar16;
              local_38 = lVar15;
              _Var6 = art_internal_validate_at
                                (*(art_node_t **)(node + uVar9 * 8 + 0x18),validator_02);
              lVar16 = local_40 + 1;
              lVar15 = local_38 + -1;
              paVar17 = paVar17 + 8;
              lVar18 = lVar18 + -1;
              uVar14 = uVar9 + 1;
            } while (_Var6);
LAB_0010760d:
            if (uVar9 < uVar11) {
              return false;
            }
            return true;
          }
          pcVar10 = "Node16 has too many children";
        }
        break;
      case (art_node_t)0x2:
        aStack_50 = validator.current_key[4];
        aStack_4f = validator.current_key[5];
        uStack_4e = validator._26_6_;
        if ((byte)node[7] < 0x11) {
          pcVar10 = "Node48 has too few children";
        }
        else if ((byte)node[7] < 0x31) {
          uVar14 = 0;
          bVar19 = false;
          uVar9 = 0;
          do {
            uVar11 = (ulong)(byte)node[uVar14 + 0x10];
            bVar4 = true;
            if (uVar11 != 0x30) {
              if ((uVar9 >> (uVar11 & 0x3f) & 1) == 0) {
                bVar4 = *(long *)(node + uVar11 * 8 + 0x110) != 0;
                if (*(long *)(node + uVar11 * 8 + 0x110) == 0) {
                  *validator.reason = "Node48 has a NULL child";
                }
                else {
                  uVar9 = uVar9 | 1L << ((byte)node[uVar14 + 0x10] & 0x3f);
                }
              }
              else {
                *validator.reason = "Node48 keys point to the same child index";
                bVar4 = false;
              }
            }
            if (!bVar4) break;
            bVar19 = 0xfe < uVar14;
            uVar14 = uVar14 + 1;
          } while (uVar14 != 0x100);
          if (!bVar19) {
            return false;
          }
          if ((*(ulong *)(node + 8) ^ uVar9) == 0xffffffffffff) {
            do {
              if (uVar9 == 0) {
                local_58 = CONCAT44(validator.current_key._0_4_,validator.depth + 1);
                uVar14 = 0;
                bVar19 = false;
                do {
                  aVar3 = node[uVar14 + 0x10];
                  if ((ulong)(byte)aVar3 != 0x30) {
                    *(char *)((long)&local_58 + (long)(int)local_58 + 3) = (char)uVar14;
                    validator_00.validate_cb = p_Var5;
                    validator_00.reason = ppcVar8;
                    validator_00.depth = (int)local_58;
                    validator_00.current_key[0] = local_58._4_1_;
                    validator_00.current_key[1] = local_58._5_1_;
                    validator_00.current_key[2] = local_58._6_1_;
                    validator_00.current_key[3] = local_58._7_1_;
                    validator_00.current_key[4] = aStack_50;
                    validator_00.current_key[5] = aStack_4f;
                    validator_00._26_6_ = uStack_4e;
                    _Var6 = art_internal_validate_at
                                      (*(art_node_t **)(node + (ulong)(byte)aVar3 * 8 + 0x110),
                                       validator_00);
                    if (!_Var6) {
                      if (bVar19) {
                        return true;
                      }
                      return false;
                    }
                  }
                  bVar19 = 0xfe < uVar14;
                  uVar14 = uVar14 + 1;
                } while (uVar14 != 0x100);
                return true;
              }
              lVar15 = 0;
              if (uVar9 != 0) {
                for (; (uVar9 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
                }
              }
              uVar9 = uVar9 - 1 & uVar9;
              for (uVar14 = uVar9; uVar14 != 0; uVar14 = uVar14 & uVar14 - 1) {
                lVar16 = 0;
                if (uVar14 != 0) {
                  for (; (uVar14 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
                  }
                }
                if (*(long *)(node + lVar15 * 8 + 0x110) == *(long *)(node + lVar16 * 8 + 0x110)) {
                  *validator.reason = "Node48 has duplicate children";
                  return false;
                }
              }
            } while( true );
          }
          pcVar10 = "Node48 available_children does not match actual children";
        }
        else {
          pcVar10 = "Node48 has too many children";
        }
        break;
      case (art_node_t)0x3:
        aStack_50 = validator.current_key[4];
        aStack_4f = validator.current_key[5];
        uStack_4e = validator._26_6_;
        if (*(ushort *)(node + 8) < 0x31) {
          pcVar10 = "Node256 has too few children";
        }
        else if (*(ushort *)(node + 8) < 0x101) {
          local_58 = CONCAT44(validator.current_key._0_4_,validator.depth + 1);
          uVar14 = 0;
          bVar19 = false;
          uVar13 = 0;
          do {
            if (*(long *)(node + uVar14 * 8 + 0x10) != 0) {
              uVar13 = uVar13 + 1;
              uVar9 = uVar14;
              while (uVar9 != 0xff) {
                lVar15 = uVar9 * 8;
                uVar9 = uVar9 + 1;
                if (*(long *)(node + uVar14 * 8 + 0x10) == *(long *)(node + lVar15 + 0x18)) {
                  *ppcVar8 = "Node256 has duplicate children";
                  goto LAB_001074d0;
                }
              }
              *(char *)((long)&local_58 + (long)(int)local_58 + 3) = (char)uVar14;
              validator_01.validate_cb = p_Var5;
              validator_01.reason = ppcVar8;
              validator_01.depth = (int)local_58;
              validator_01.current_key[0] = local_58._4_1_;
              validator_01.current_key[1] = local_58._5_1_;
              validator_01.current_key[2] = local_58._6_1_;
              validator_01.current_key[3] = local_58._7_1_;
              validator_01.current_key[4] = aStack_50;
              validator_01.current_key[5] = aStack_4f;
              validator_01._26_6_ = uStack_4e;
              _Var6 = art_internal_validate_at
                                (*(art_node_t **)(node + uVar14 * 8 + 0x10),validator_01);
              if (!_Var6) break;
            }
            bVar19 = 0xfe < uVar14;
            uVar14 = uVar14 + 1;
          } while (uVar14 != 0x100);
LAB_001074d0:
          if (!bVar19) {
            return false;
          }
          if (uVar13 == *(ushort *)(node + 8)) {
            return true;
          }
          pcVar10 = "Node256 count does not match actual children";
        }
        else {
          pcVar10 = "Node256 has too many children";
        }
        break;
      default:
        pcVar10 = "invalid node type";
      }
    }
    else {
      pcVar10 = "node has too much prefix at given depth";
    }
  }
  else {
    uVar14 = (ulong)(byte)validator.depth;
    validator.depth = iVar7;
    iVar7 = bcmp((art_val_t *)((ulong)node & 0xfffffffffffffffe),validator.current_key,uVar14);
    ppcVar8 = validator.reason;
    if (iVar7 == 0) {
      if (validator.validate_cb == (art_validate_cb_t)0x0) {
        return true;
      }
      _Var6 = (*validator.validate_cb)
                        ((art_val_t *)((ulong)node & 0xfffffffffffffffe),validator.reason);
      if (!_Var6) {
        if (*ppcVar8 != (char *)0x0) {
          return false;
        }
        *ppcVar8 = "leaf validation failed";
        return false;
      }
      return true;
    }
    pcVar10 = "leaf key does not match its position\'s prefix in the tree";
  }
  *ppcVar8 = pcVar10;
  return false;
}

Assistant:

static bool art_internal_validate_at(const art_node_t *node,
                                     art_internal_validate_t validator) {
    if (node == NULL) {
        return art_validate_fail(&validator, "node is null");
    }
    if (art_is_leaf(node)) {
        art_leaf_t *leaf = CAST_LEAF(node);
        if (art_compare_prefix(leaf->key, 0, validator.current_key, 0,
                               validator.depth) != 0) {
            return art_validate_fail(
                &validator,
                "leaf key does not match its position's prefix in the tree");
        }
        if (validator.validate_cb != NULL &&
            !validator.validate_cb(leaf, validator.reason)) {
            if (*validator.reason == NULL) {
                *validator.reason = "leaf validation failed";
            }
            return false;
        }
    } else {
        art_inner_node_t *inner_node = (art_inner_node_t *)node;

        if (validator.depth + inner_node->prefix_size + 1 > ART_KEY_BYTES) {
            return art_validate_fail(&validator,
                                     "node has too much prefix at given depth");
        }
        memcpy(validator.current_key + validator.depth, inner_node->prefix,
               inner_node->prefix_size);
        validator.depth += inner_node->prefix_size;

        switch (inner_node->typecode) {
            case ART_NODE4_TYPE:
                if (!art_node4_internal_validate((art_node4_t *)inner_node,
                                                 validator)) {
                    return false;
                }
                break;
            case ART_NODE16_TYPE:
                if (!art_node16_internal_validate((art_node16_t *)inner_node,
                                                  validator)) {
                    return false;
                }
                break;
            case ART_NODE48_TYPE:
                if (!art_node48_internal_validate((art_node48_t *)inner_node,
                                                  validator)) {
                    return false;
                }
                break;
            case ART_NODE256_TYPE:
                if (!art_node256_internal_validate((art_node256_t *)inner_node,
                                                   validator)) {
                    return false;
                }
                break;
            default:
                return art_validate_fail(&validator, "invalid node type");
        }
    }
    return true;
}